

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O3

string * hex2bin(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pcVar5;
  string extract;
  char *local_58;
  char *local_50;
  char local_48 [16];
  char *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_58 = local_48;
  local_50 = (char *)0x0;
  local_48[0] = '\0';
  pcVar5 = (s->_M_dataplus)._M_p;
  while( true ) {
    if ((s->_M_dataplus)._M_p + s->_M_string_length <= pcVar5) {
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::replace((ulong)&local_58,0,local_50,(ulong)pcVar5);
    __nptr = local_58;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol(__nptr,&local_38,0x10);
    if (local_38 == __nptr) break;
    if (((int)lVar3 != lVar3) || (*piVar2 == 0x22)) goto LAB_0010c60b;
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    pcVar5 = pcVar5 + 2;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__throw_invalid_argument("stoi");
LAB_0010c60b:
  uVar4 = std::__throw_out_of_range("stoi");
  pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &__return_storage_ptr__->field_2) {
    operator_delete(pcVar5);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

std::string hex2bin(std::string s) {
//    std::cout<<"String to dehash: "<<s<<std::endl;
//    if(s.length()&1) - no need at all as we know that s is bin2hex string
//        s = "0"+s;

    std::string sOut;
    sOut.reserve(s.length()/2);

    std::string extract;
    for (std::string::const_iterator pos = s.begin(); pos<s.end(); pos += 2)
    {
        extract.assign(pos, pos+2);
        sOut.push_back(std::stoi(extract, nullptr, 16));
    }
    return sOut;
}